

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O2

Value * soul::Value::zeroInitialiser(Value *__return_storage_ptr__,Type *t)

{
  Type local_28;
  
  if ((t->category != invalid) &&
     (local_28.primitiveType.type = (t->primitiveType).type, local_28.primitiveType.type != void_))
  {
    local_28.category = t->category;
    local_28.arrayElementCategory = t->arrayElementCategory;
    local_28.isRef = t->isRef;
    local_28.isConstant = t->isConstant;
    local_28.boundingSize = t->boundingSize;
    local_28.arrayElementBoundingSize = t->arrayElementBoundingSize;
    local_28.structure.object = (t->structure).object;
    (t->structure).object = (Structure *)0x0;
    Value(__return_storage_ptr__,&local_28);
    RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_28.structure);
    return __return_storage_ptr__;
  }
  throwInternalCompilerError("t.isValid() && ! t.isVoid()","zeroInitialiser",0x207);
}

Assistant:

StringDictionary::Handle getStringLiteral() const
    {
        SOUL_ASSERT (type.isStringLiteral());
        return getAs<StringDictionary::Handle>();
    }